

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::CleanTestOutput
          (cmCTestTestHandler *this,string *output,size_t length,TruncationMode truncate)

{
  char *begin_00;
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  char *current_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  char *current_1;
  char *local_b0;
  char *current;
  char *end;
  char *begin;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string msg;
  anon_class_1_0_00000001 utf8_advance;
  TruncationMode truncate_local;
  size_t length_local;
  string *output_local;
  cmCTestTestHandler *this_local;
  
  if (((length != 0) &&
      (msg.field_2._12_4_ = truncate, uVar1 = std::__cxx11::string::size(), length < uVar1)) &&
     (lVar2 = std::__cxx11::string::find((char *)output,0xe01b8b), lVar2 == -1)) {
    std::__cxx11::to_string(&local_88,length);
    std::operator+(&local_68,
                   "\n[This part of the test output was removed since it exceeds the threshold of ",
                   &local_88);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68," bytes.]\n");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    end = pcVar3;
    lVar2 = std::__cxx11::string::size();
    begin_00 = end;
    pcVar3 = pcVar3 + lVar2;
    current = pcVar3;
    if (msg.field_2._12_4_ == 2) {
      lVar2 = std::__cxx11::string::size();
      local_b0 = CleanTestOutput::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)(msg.field_2._M_local_buf + 0xb),begin_00,
                            pcVar3,lVar2 - length);
      std::__cxx11::string::erase((ulong)output,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&current_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "...");
      std::__cxx11::string::insert((ulong)output,(string *)0x0);
      std::__cxx11::string::~string((string *)&current_1);
    }
    else if (msg.field_2._12_4_ == 1) {
      local_d8 = CleanTestOutput::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)(msg.field_2._M_local_buf + 0xb),end,pcVar3,
                            length >> 1);
      uVar1 = (long)local_d8 - (long)end;
      std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)output,uVar1);
      psVar4 = (string *)(local_d8 + -(long)end);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&current_2
                     ,"...",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48);
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&current_2
                     ,"...");
      std::__cxx11::string::insert((ulong)output,psVar4);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&current_2);
    }
    else {
      local_120 = CleanTestOutput::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)(msg.field_2._M_local_buf + 0xb),end,pcVar3,
                             length);
      std::__cxx11::string::erase((ulong)output,(long)local_120 - (long)end);
      std::operator+(&local_140,"...",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::__cxx11::string::operator+=((string *)output,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmCTestTestHandler::CleanTestOutput(std::string& output, size_t length,
                                         cmCTestTypes::TruncationMode truncate)
{
  if (!length || length >= output.size() ||
      output.find("CTEST_FULL_OUTPUT") != std::string::npos) {
    return;
  }

  // Advance n bytes in string delimited by begin/end but do not break in the
  // middle of a multi-byte UTF-8 encoding.
  auto utf8_advance = [](char const* const begin, char const* const end,
                         size_t n) -> const char* {
    char const* const stop = begin + n;
    char const* current = begin;
    while (current < stop) {
      unsigned int ch;
      if (const char* next = cm_utf8_decode_character(current, end, &ch)) {
        if (next > stop) {
          break;
        }
        current = next;
      } else // Bad byte will be handled by cmXMLWriter.
      {
        ++current;
      }
    }
    return current;
  };

  // Truncation message.
  const std::string msg =
    "\n[This part of the test output was removed since it "
    "exceeds the threshold of " +
    std::to_string(length) + " bytes.]\n";

  char const* const begin = output.c_str();
  char const* const end = begin + output.size();

  // Erase head, middle or tail of output.
  if (truncate == cmCTestTypes::TruncationMode::Head) {
    char const* current = utf8_advance(begin, end, output.size() - length);
    output.erase(0, current - begin);
    output.insert(0, msg + "...");
  } else if (truncate == cmCTestTypes::TruncationMode::Middle) {
    char const* current = utf8_advance(begin, end, length / 2);
    output.erase(current - begin, output.size() - length);
    output.insert(current - begin, "..." + msg + "...");
  } else { // default or "tail"
    char const* current = utf8_advance(begin, end, length);
    output.erase(current - begin);
    output += ("..." + msg);
  }
}